

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O1

bool cmHexFileConverter::TryConvert(string *inFileName,string *outFileName)

{
  bool bVar1;
  FileType FVar2;
  uint uVar3;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar4;
  uint startIndex;
  bool bVar5;
  char buf [1024];
  char local_438;
  undefined1 local_437;
  char local_431;
  byte local_430;
  
  FVar2 = DetermineFileType(inFileName);
  if (FVar2 != Binary) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(inFileName,"rb");
    __stream_00 = (FILE *)cmsys::SystemTools::Fopen(outFileName,"wb");
    if (__stream != (FILE *)0x0 && __stream_00 != (FILE *)0x0) {
      pcVar4 = fgets(&local_438,0x400,__stream);
      if (pcVar4 == (char *)0x0) {
        bVar1 = false;
      }
      else {
        do {
          uVar3 = ChompStrlen(&local_438);
          if (FVar2 == MotorolaSrec) {
            if (((uVar3 & 1) == 0 && uVar3 - 10 < 0x205) && local_438 == 'S') {
              bVar1 = true;
              switch(local_437) {
              case 0x31:
                startIndex = 8;
                break;
              case 0x32:
                startIndex = 10;
                break;
              case 0x33:
                startIndex = 0xc;
                break;
              default:
                goto switchD_001db405_caseD_34;
              case 0x35:
              case 0x37:
              case 0x38:
              case 0x39:
                goto switchD_001db405_caseD_35;
              }
LAB_001db471:
              bVar1 = OutputBin((FILE *)__stream_00,&local_438,startIndex,uVar3 - 2);
            }
            else {
switchD_001db405_caseD_34:
              bVar1 = false;
            }
          }
          else {
            bVar5 = false;
            bVar1 = false;
            if ((((uVar3 - 0xb < 0x201) && (bVar1 = bVar5, (uVar3 & 1) != 0)) && (local_438 == ':'))
               && ((local_431 == '0' && (bVar1 = true, 3 < local_430 - 0x32)))) {
              if (local_430 - 0x30 < 2) {
                startIndex = 9;
                goto LAB_001db471;
              }
              goto switchD_001db405_caseD_34;
            }
          }
switchD_001db405_caseD_35:
        } while ((bVar1 != false) &&
                (pcVar4 = fgets(&local_438,0x400,__stream), pcVar4 != (char *)0x0));
      }
      fclose(__stream);
      fclose(__stream_00);
      return bVar1;
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (__stream_00 != (FILE *)0x0) {
      fclose(__stream_00);
    }
  }
  return false;
}

Assistant:

bool cmHexFileConverter::TryConvert(const std::string& inFileName,
                                    const std::string& outFileName)
{
  FileType type = DetermineFileType(inFileName);
  if (type == Binary) {
    return false;
  }

  // try to open the file
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  FILE* outFile = cmsys::SystemTools::Fopen(outFileName, "wb");
  if ((inFile == nullptr) || (outFile == nullptr)) {
    if (inFile != nullptr) {
      fclose(inFile);
    }
    if (outFile != nullptr) {
      fclose(outFile);
    }
    return false;
  }

  // convert them line by line
  bool success = false;
  char buf[1024];
  while (fgets(buf, 1024, inFile) != nullptr) {
    if (type == MotorolaSrec) {
      success = ConvertMotorolaSrecLine(buf, outFile);
    } else if (type == IntelHex) {
      success = ConvertIntelHexLine(buf, outFile);
    }
    if (!success) {
      break;
    }
  }

  // close them again
  fclose(inFile);
  fclose(outFile);
  return success;
}